

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

float Gia_ManLevelAve(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  int iVar2;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x211,"float Gia_ManLevelAve(Gia_Man_t *)");
  }
  v = 0;
  iVar2 = 0;
  do {
    iVar1 = p->vCos->nSize;
    if (iVar1 <= v) {
LAB_00213d15:
      return (float)iVar2 / (float)iVar1;
    }
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      iVar1 = p->vCos->nSize;
      goto LAB_00213d15;
    }
    iVar1 = Gia_ObjLevel(p,pObj);
    iVar2 = iVar2 + iVar1;
    v = v + 1;
  } while( true );
}

Assistant:

float Gia_ManLevelAve( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, Ave = 0;
    assert( p->vLevels );
    Gia_ManForEachCo( p, pObj, i )
        Ave += Gia_ObjLevel(p, pObj);
    return (float)Ave / Gia_ManCoNum(p);
}